

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBuiltinFunctions.hpp
# Opt level: O0

void __thiscall
rsg::
UnaryBuiltinVecFunc<rsg::GetUnaryBuiltinVecWeight<rsg::AcosOp>,_rsg::ComputeUnaryBuiltinVecRange<rsg::AcosOp>,_rsg::EvaluateUnaryBuiltinVec<rsg::AcosOp>_>
::evaluate(UnaryBuiltinVecFunc<rsg::GetUnaryBuiltinVecWeight<rsg::AcosOp>,_rsg::ComputeUnaryBuiltinVecRange<rsg::AcosOp>,_rsg::EvaluateUnaryBuiltinVec<rsg::AcosOp>_>
           *this,ExecutionContext *execCtx)

{
  int iVar1;
  undefined4 extraout_var;
  VariableType *pVVar2;
  float *pfVar3;
  float fVar4;
  EvaluateUnaryBuiltinVec<rsg::AcosOp> local_65;
  int local_64;
  undefined1 auStack_60 [4];
  int compNdx;
  ExecValueAccess dstComp;
  ExecConstValueAccess srcComp;
  undefined1 auStack_38 [4];
  int elemNdx;
  ExecValueAccess dstValue;
  ExecConstValueAccess srcValue;
  ExecutionContext *execCtx_local;
  UnaryBuiltinVecFunc<rsg::GetUnaryBuiltinVecWeight<rsg::AcosOp>,_rsg::ComputeUnaryBuiltinVecRange<rsg::AcosOp>,_rsg::EvaluateUnaryBuiltinVec<rsg::AcosOp>_>
  *this_local;
  
  (*this->m_child->_vptr_Expression[4])(this->m_child,execCtx);
  iVar1 = (*this->m_child->_vptr_Expression[5])();
  dstValue.super_ConstStridedValueAccess<64>.m_value = (Scalar *)CONCAT44(extraout_var,iVar1);
  pVVar2 = ValueRange::getType(&this->m_inValueRange);
  _auStack_38 = (ConstStridedValueAccess<64>)ValueStorage<64>::getValue(&this->m_value,pVVar2);
  srcComp.m_value._4_4_ = 0;
  while( true ) {
    pVVar2 = ValueRange::getType(&this->m_inValueRange);
    iVar1 = VariableType::getNumElements(pVVar2);
    if (iVar1 <= srcComp.m_value._4_4_) break;
    join_0x00000010_0x00000000_ =
         ConstStridedValueAccess<64>::component
                   ((ConstStridedValueAccess<64> *)
                    &dstValue.super_ConstStridedValueAccess<64>.m_value,srcComp.m_value._4_4_);
    _auStack_60 = (ConstStridedValueAccess<64>)
                  StridedValueAccess<64>::component
                            ((StridedValueAccess<64> *)auStack_38,srcComp.m_value._4_4_);
    for (local_64 = 0; local_64 < 0x40; local_64 = local_64 + 1) {
      fVar4 = ConstStridedValueAccess<64>::asFloat
                        ((ConstStridedValueAccess<64> *)
                         &dstComp.super_ConstStridedValueAccess<64>.m_value,local_64);
      fVar4 = EvaluateUnaryBuiltinVec<rsg::AcosOp>::operator()(&local_65,fVar4);
      pfVar3 = StridedValueAccess<64>::asFloat((StridedValueAccess<64> *)auStack_60,local_64);
      *pfVar3 = fVar4;
    }
    srcComp.m_value._4_4_ = srcComp.m_value._4_4_ + 1;
  }
  return;
}

Assistant:

void UnaryBuiltinVecFunc<GetValueRangeWeight, ComputeValueRange, Evaluate>::evaluate (ExecutionContext& execCtx)
{
	m_child->evaluate(execCtx);

	ExecConstValueAccess	srcValue	= m_child->getValue();
	ExecValueAccess			dstValue	= m_value.getValue(m_inValueRange.getType());

	for (int elemNdx = 0; elemNdx < m_inValueRange.getType().getNumElements(); elemNdx++)
	{
		ExecConstValueAccess	srcComp		= srcValue.component(elemNdx);
		ExecValueAccess			dstComp		= dstValue.component(elemNdx);

		for (int compNdx = 0; compNdx < EXEC_VEC_WIDTH; compNdx++)
			dstComp.asFloat(compNdx) = Evaluate()(srcComp.asFloat(compNdx));
	}
}